

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameterization.cpp
# Opt level: O3

void __thiscall Parameterization::PrintPlot3DHeader(Parameterization *this,ofstream *outfile)

{
  int iVar1;
  long *plVar2;
  ostream *poVar3;
  
  plVar2 = (long *)std::ostream::operator<<((ostream *)outfile,this->Gmax);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  this->G = 0;
  if (0 < this->Gmax) {
    do {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)outfile,this->Jmax);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->Kmax);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      plVar2 = (long *)std::ostream::operator<<(poVar3,this->Lmax);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      iVar1 = this->G + 1;
      this->G = iVar1;
    } while (iVar1 < this->Gmax);
  }
  return;
}

Assistant:

void Parameterization::PrintPlot3DHeader(ofstream& outfile) {
  outfile << Gmax << endl;
  for (G = 0; G < Gmax; G++) {
    outfile << Jmax << " " << Kmax << " " << Lmax << endl;
  }
}